

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_declare_keyword(Parser *this)

{
  Type TVar1;
  Token *pTVar2;
  AbstractSyntaxNode *pAVar3;
  ostream *poVar4;
  parser_exception *this_00;
  string local_368;
  int local_344;
  TokenPosition local_340;
  int local_324;
  string local_320;
  Type local_2fc;
  Token local_2f8;
  int local_29c [5];
  Token local_288;
  int local_22c [5];
  Token local_218;
  int local_1bc [6];
  int local_1a4;
  stringstream local_1a0 [8];
  stringstream buffer;
  ostream local_190 [376];
  int local_18 [2];
  Parser *local_10;
  Parser *this_local;
  
  pAVar3 = this->current_;
  local_18[1] = 0x35;
  local_18[0] = 1;
  local_10 = this;
  pTVar2 = forward_token(this,local_18);
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_18 + 1),pTVar2);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = 1;
  pTVar2 = forward_token(this,&local_1a4);
  TVar1 = Token::type(pTVar2);
  if (TVar1 == kInt) {
    pAVar3 = this->current_;
    local_1bc[1] = 6;
    local_1bc[0] = 1;
    pTVar2 = forward_token(this,local_1bc);
    AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_1bc + 1),pTVar2);
    local_22c[4] = 6;
    match(&local_218,this,(Type *)(local_22c + 4));
    Token::~Token(&local_218);
    local_22c[3] = 1;
    pTVar2 = forward_token(this,local_22c + 3);
    TVar1 = Token::type(pTVar2);
    if (TVar1 == kLeftBracket) {
      parse_array(this);
    }
  }
  else {
    local_22c[2] = 1;
    pTVar2 = forward_token(this,local_22c + 2);
    TVar1 = Token::type(pTVar2);
    if (TVar1 == kReal) {
      pAVar3 = this->current_;
      local_22c[1] = 7;
      local_22c[0] = 1;
      pTVar2 = forward_token(this,local_22c);
      AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_22c + 1),pTVar2);
      local_29c[4] = 7;
      match(&local_288,this,(Type *)(local_29c + 4));
      Token::~Token(&local_288);
      local_29c[3] = 1;
      pTVar2 = forward_token(this,local_29c + 3);
      TVar1 = Token::type(pTVar2);
      if (TVar1 == kLeftBracket) {
        parse_array(this);
      }
    }
    else {
      local_29c[2] = 1;
      pTVar2 = forward_token(this,local_29c + 2);
      TVar1 = Token::type(pTVar2);
      if (TVar1 != kVoid) {
        poVar4 = std::operator<<(local_190,anon_var_dwarf_5f8ef);
        local_324 = 1;
        pTVar2 = forward_token(this,&local_324);
        Token::content_abi_cxx11_(&local_320,pTVar2);
        poVar4 = std::operator<<(poVar4,(string *)&local_320);
        std::operator<<(poVar4,anon_var_dwarf_5f947);
        std::__cxx11::string::~string((string *)&local_320);
        this_00 = (parser_exception *)__cxa_allocate_exception(0x40);
        local_344 = 1;
        pTVar2 = forward_token(this,&local_344);
        Token::position(&local_340,pTVar2);
        std::__cxx11::stringstream::str();
        parser_exception::parser_exception(this_00,&local_340,&local_368);
        __cxa_throw(this_00,&parser_exception::typeinfo,parser_exception::~parser_exception);
      }
      pAVar3 = this->current_;
      local_29c[1] = 8;
      local_29c[0] = 1;
      pTVar2 = forward_token(this,local_29c);
      AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_29c + 1),pTVar2);
      local_2fc = kVoid;
      match(&local_2f8,this,&local_2fc);
      Token::~Token(&local_2f8);
    }
  }
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Parser::parse_declare_keyword() {
    current_ = current_->add_child(Token::Type::kDeclareKeyword, forward_token());
    std::stringstream buffer;

    if (forward_token().type() == Token::Type::kInt) {
        current_->add_child(Token::Type::kInt, forward_token());
        match(Token::Type::kInt);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
    } else if (forward_token().type() == Token::Type::kReal) {
        current_->add_child(Token::Type::kReal, forward_token());
        match(Token::Type::kReal);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
    } else if (forward_token().type() == Token::Type::kVoid) {
        current_->add_child(Token::Type::kVoid, forward_token());
        match(Token::Type::kVoid);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 定义关键字仅允许 int / real / void";
        throw parser_exception(forward_token().position(), buffer.str());
    }

    current_ = current_->parent();
}